

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O1

int IDAAglocal(sunindextype NlocalB,sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector gvalB,
              void *ida_mem)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  int iVar4;
  
  lVar1 = *(long *)((long)ida_mem + 0x840);
  lVar2 = *(long *)(lVar1 + 0x40);
  puVar3 = *(undefined8 **)(lVar2 + 0x58);
  if ((*(int *)(lVar1 + 0xc0) == 0) &&
     (iVar4 = (**(code **)(lVar1 + 0x98))
                        (tt,ida_mem,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),0,
                         0,gvalB), iVar4 != 0)) {
    IDAProcessError((IDAMem)ida_mem,-1,0x387,"IDAAglocal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_bbdpre.c"
                    ,"Bad t for interpolation.",tt);
    return -1;
  }
  iVar4 = (*(code *)*puVar3)(NlocalB,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),
                             yyB,ypB,gvalB,*(undefined8 *)(lVar2 + 0x40));
  return iVar4;
}

Assistant:

static int IDAAglocal(sunindextype NlocalB, sunrealtype tt, N_Vector yyB,
                      N_Vector ypB, N_Vector gvalB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDABBDPrecDataB idabbdB_mem;
  int flag;

  IDA_mem    = (IDAMem)ida_mem;
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Get current backward problem. */
  IDAB_mem = IDAADJ_mem->ia_bckpbCrt;

  /* Get the preconditioner's memory. */
  idabbdB_mem = (IDABBDPrecDataB)IDAB_mem->ida_pmem;

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                               IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (flag != IDA_SUCCESS)
    {
      IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_BAD_T);
      return (-1);
    }
  }
  /* Call user's adjoint LocalFnB function. */
  return idabbdB_mem->glocalB(NlocalB, tt, IDAADJ_mem->ia_yyTmp,
                              IDAADJ_mem->ia_ypTmp, yyB, ypB, gvalB,
                              IDAB_mem->ida_user_data);
}